

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O2

void __thiscall adios2::core::engine::BP5Writer::DestructorClose(BP5Writer *this,bool Verbose)

{
  ostream *poVar1;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,Verbose) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"BP5 Writer \"");
    poVar1 = std::operator<<(poVar1,(string *)&(this->super_Engine).m_Name);
    poVar1 = std::operator<<(poVar1,"\" Destroyed without a prior Close().");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cerr,"This may result in corrupt output.");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  UpdateActiveFlag(this,false);
  (this->super_Engine).m_IsOpen = false;
  return;
}

Assistant:

void BP5Writer::DestructorClose(bool Verbose) noexcept
{
    if (Verbose)
    {
        std::cerr << "BP5 Writer \"" << m_Name << "\" Destroyed without a prior Close()."
                  << std::endl;
        std::cerr << "This may result in corrupt output." << std::endl;
    }
    // close metadata index file
    UpdateActiveFlag(false);
    m_IsOpen = false;
}